

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O1

uint __thiscall FVoxelModel::AddVertex(FVoxelModel *this,FModelVertex *vert,FVoxelMap *check)

{
  FModelVertex *pFVar1;
  FModelVertex FVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Node *pNVar6;
  uint uVar7;
  
  FVar2 = *vert;
  pNVar6 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::FindKey(check,*vert);
  if (pNVar6 == (Node *)0x0) {
    pNVar6 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey(check,FVar2);
    (pNVar6->Pair).Value = 0xffffffff;
  }
  uVar7 = (pNVar6->Pair).Value;
  if (uVar7 == 0xffffffff) {
    TArray<FModelVertex,_FModelVertex>::Grow(&this->mVertices,1);
    pFVar1 = (this->mVertices).Array;
    uVar7 = (this->mVertices).Count;
    pFVar1[uVar7].v = vert->v;
    fVar3 = vert->y;
    fVar4 = vert->z;
    fVar5 = vert->u;
    pFVar1 = pFVar1 + uVar7;
    pFVar1->x = vert->x;
    pFVar1->y = fVar3;
    pFVar1->z = fVar4;
    pFVar1->u = fVar5;
    uVar7 = (this->mVertices).Count;
    (this->mVertices).Count = uVar7 + 1;
    FVar2 = *vert;
    pNVar6 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::FindKey(check,*vert);
    if (pNVar6 == (Node *)0x0) {
      pNVar6 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey(check,FVar2);
      (pNVar6->Pair).Value = 0xffffffff;
    }
    (pNVar6->Pair).Value = uVar7;
  }
  return uVar7;
}

Assistant:

unsigned int FVoxelModel::AddVertex(FModelVertex &vert, FVoxelMap &check)
{
	unsigned int index = check[vert];
	if (index == 0xffffffff)
	{
		index = check[vert] =mVertices.Push(vert);
	}
	return index;
}